

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt.cpp
# Opt level: O3

char * fmt::v6::internal::sprintf_format<long_double>
                 (longdouble value,buffer<char> *buf,sprintf_specs specs)

{
  uint uVar1;
  undefined2 *puVar2;
  byte bVar3;
  byte bVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte bVar7;
  byte *pbVar8;
  byte *__src;
  ulong uVar9;
  byte *pbVar10;
  ulong uVar11;
  byte *pbVar12;
  char format [10];
  char local_46;
  undefined1 local_45 [2];
  undefined1 local_43 [7];
  longdouble local_3c;
  
  local_3c = value;
  local_46 = '%';
  bVar7 = specs.type;
  if (((ulong)specs >> 0x28 & 1) == 0 && bVar7 != 0) {
    puVar2 = (undefined2 *)local_45;
  }
  else {
    puVar2 = (undefined2 *)(local_45 + 1);
    local_45[0] = 0x23;
  }
  if (-1 < specs.precision) {
    *puVar2 = 0x2a2e;
    puVar2 = puVar2 + 1;
  }
  *(undefined1 *)puVar2 = 0x4c;
  bVar3 = bVar7;
  if (bVar7 == 0x6e) {
    bVar3 = 0x67;
  }
  if (bVar7 == 0) {
    bVar3 = 0x67;
  }
  bVar4 = 0x66;
  if (bVar7 != 0x25) {
    bVar4 = bVar3;
  }
  *(byte *)((long)puVar2 + 1) = bVar4;
  *(undefined1 *)(puVar2 + 1) = 0;
LAB_0016eda4:
  uVar1 = format_float<long_double>(buf->ptr_,buf->capacity_,&local_46,specs.precision,local_3c);
  if ((int)uVar1 < 0) goto LAB_0016edd6;
  uVar9 = (ulong)uVar1;
  uVar11 = buf->capacity_;
  if (uVar11 <= uVar9) {
    uVar11 = (ulong)(uVar1 + 1);
    goto LAB_0016ede3;
  }
  pbVar6 = (byte *)buf->ptr_;
  if ((*pbVar6 == 0x2d) || (pbVar10 = pbVar6, *pbVar6 == 0x2b)) {
    pbVar10 = pbVar6 + 1;
  }
  pbVar12 = (byte *)0x0;
  if (((bVar7 & 0xdf) != 0x41) && (pbVar8 = pbVar6 + uVar9, pbVar10 < pbVar8)) {
    pbVar12 = (byte *)0x0;
    do {
      pbVar5 = pbVar10 + 1;
      if (9 < (byte)(*pbVar10 - 0x30)) {
        if ((*pbVar10 | 0x20) == 0x65) {
          pbVar12 = (byte *)0x0;
        }
        else {
          pbVar12 = pbVar10;
          if (bVar7 == 0) {
            pbVar10 = pbVar10 + 2;
            if (*pbVar5 != 0x30) {
              pbVar10 = pbVar5;
            }
            pbVar5 = pbVar8;
            if (pbVar10 == pbVar8) goto LAB_0016ee8f;
            pbVar6 = pbVar6 + (uVar9 - (long)pbVar10);
            goto LAB_0016ee70;
          }
        }
        break;
      }
      pbVar10 = pbVar5;
    } while (pbVar5 < pbVar8);
  }
  goto LAB_0016ee98;
LAB_0016edd6:
  if (buf->capacity_ != 0xffffffffffffffff) {
    uVar11 = buf->capacity_ + 1;
LAB_0016ede3:
    (**buf->_vptr_buffer)(buf,uVar11);
  }
  goto LAB_0016eda4;
  while( true ) {
    pbVar10 = pbVar10 + 1;
    pbVar6 = pbVar6 + -1;
    if (pbVar10 == pbVar8) break;
LAB_0016ee70:
    if (8 < (byte)(*pbVar10 - 0x31)) {
      __src = pbVar10;
      pbVar5 = pbVar10;
      if (pbVar10 != pbVar8) goto LAB_0016eec6;
      break;
    }
  }
  goto LAB_0016ee8f;
  while( true ) {
    __src = __src + 1;
    pbVar6 = pbVar6 + -1;
    if (__src == pbVar8) break;
LAB_0016eec6:
    if (*__src != 0x30) {
      if (0xf5 < (byte)(*__src - 0x3a)) goto LAB_0016ee98;
      memmove(pbVar10,__src,(size_t)pbVar6);
      uVar11 = buf->capacity_;
      pbVar8 = __src;
      break;
    }
  }
LAB_0016ee8f:
  uVar9 = (ulong)(uVar1 + ((int)pbVar5 - (int)pbVar8));
LAB_0016ee98:
  if (uVar11 < uVar9) {
    (**buf->_vptr_buffer)(buf,uVar9);
  }
  buf->size_ = uVar9;
  return (char *)pbVar12;
}

Assistant:

char *sprintf_format(Double value, internal::buffer<char> &buf, sprintf_specs specs)
{
    // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
    FMT_ASSERT(buf.capacity() != 0, "empty buffer");

    // Build format string.
    enum
    {
        max_format_size = 10
    }; // longest format: %#-*.*Lg
    char format[max_format_size];
    char *format_ptr = format;
    *format_ptr++ = '%';
    if (specs.alt || !specs.type)
        *format_ptr++ = '#';
    if (specs.precision >= 0)
    {
        *format_ptr++ = '.';
        *format_ptr++ = '*';
    }
    if (std::is_same<Double, long double>::value)
        *format_ptr++ = 'L';

    char type = specs.type;

    if (type == '%')
        type = 'f';
    else if (type == 0 || type == 'n')
        type = 'g';
#if FMT_MSC_VER
    if (type == 'F')
    {
        // MSVC's printf doesn't support 'F'.
        type = 'f';
    }
#endif
    *format_ptr++ = type;
    *format_ptr = '\0';

    // Format using snprintf.
    char *start = nullptr;
    char *decimal_point_pos = nullptr;
    for (;;)
    {
        std::size_t buffer_size = buf.capacity();
        start = &buf[0];
        int result = format_float(start, buffer_size, format, specs.precision, value);
        if (result >= 0)
        {
            unsigned n = internal::to_unsigned(result);
            if (n < buf.capacity())
            {
                // Find the decimal point.
                auto p = buf.data(), end = p + n;
                if (*p == '+' || *p == '-')
                    ++p;
                if (specs.type != 'a' && specs.type != 'A')
                {
                    while (p < end && *p >= '0' && *p <= '9')
                        ++p;
                    if (p < end && *p != 'e' && *p != 'E')
                    {
                        decimal_point_pos = p;
                        if (!specs.type)
                        {
                            // Keep only one trailing zero after the decimal point.
                            ++p;
                            if (*p == '0')
                                ++p;
                            while (p != end && *p >= '1' && *p <= '9')
                                ++p;
                            char *where = p;
                            while (p != end && *p == '0')
                                ++p;
                            if (p == end || *p < '0' || *p > '9')
                            {
                                if (p != end)
                                    std::memmove(where, p, to_unsigned(end - p));
                                n -= static_cast<unsigned>(p - where);
                            }
                        }
                    }
                }
                buf.resize(n);
                break; // The buffer is large enough - continue with formatting.
            }
            buf.reserve(n + 1);
        }
        else
        {
            // If result is negative we ask to increase the capacity by at least 1,
            // but as std::vector, the buffer grows exponentially.
            buf.reserve(buf.capacity() + 1);
        }
    }
    return decimal_point_pos;
}